

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StickyAdapter.cpp
# Opt level: O1

StickyAtypeParameters * __thiscall
OpenMD::StickyAdapter::getStickyParam
          (StickyAtypeParameters *__return_storage_ptr__,StickyAdapter *this)

{
  RealType RVar1;
  RealType RVar2;
  RealType RVar3;
  RealType RVar4;
  RealType RVar5;
  RealType RVar6;
  undefined8 uVar7;
  bool bVar8;
  long lVar9;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  shared_ptr<OpenMD::GenericData> data;
  undefined1 local_58 [16];
  string local_48;
  
  bVar8 = AtomType::hasProperty(this->at_,(string *)OpenMD::StickyTypeID_abi_cxx11_);
  if (!bVar8) {
    AtomType::getName_abi_cxx11_(&local_48,this->at_);
    snprintf(painCave.errMsg,2000,
             "StickyAdapter::getStickyParam was passed an atomType (%s)\n\tthat does not appear to be a Sticky atom.\n"
             ,local_48._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
    painCave.isFatal = 1;
    painCave.severity = 1;
    simError();
  }
  AtomType::getPropertyByName((AtomType *)local_58,(string *)this->at_);
  if ((_func_int **)local_58._0_8_ == (_func_int **)0x0) {
    AtomType::getName_abi_cxx11_(&local_48,this->at_);
    snprintf(painCave.errMsg,2000,
             "StickyAdapter::getStickyParam could not find Sticky\n\tparameters for atomType %s.\n",
             local_48._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
    painCave.isFatal = 1;
    painCave.severity = 1;
    simError();
  }
  if ((_func_int **)local_58._0_8_ == (_func_int **)0x0) {
    lVar9 = 0;
  }
  else {
    lVar9 = __dynamic_cast(local_58._0_8_,&GenericData::typeinfo,
                           &SimpleTypeData<OpenMD::StickyAtypeParameters>::typeinfo,0);
  }
  if (lVar9 == 0) {
    lVar9 = 0;
    this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  else {
    this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(_Atomic_word *)(local_58._8_8_ + 8) = *(_Atomic_word *)(local_58._8_8_ + 8) + 1;
        UNLOCK();
      }
      else {
        *(_Atomic_word *)(local_58._8_8_ + 8) = *(_Atomic_word *)(local_58._8_8_ + 8) + 1;
      }
    }
  }
  if (lVar9 == 0) {
    AtomType::getName_abi_cxx11_(&local_48,this->at_);
    snprintf(painCave.errMsg,2000,
             "StickyAdapter::getStickyParam could not convert\n\tGenericData to StickyAtypeData for atom type %s\n"
             ,local_48._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
    painCave.isFatal = 1;
    painCave.severity = 1;
    simError();
  }
  RVar1 = *(RealType *)(lVar9 + 0x28);
  RVar2 = *(RealType *)(lVar9 + 0x30);
  RVar3 = *(RealType *)(lVar9 + 0x38);
  RVar4 = *(RealType *)(lVar9 + 0x40);
  RVar5 = *(RealType *)(lVar9 + 0x48);
  RVar6 = *(RealType *)(lVar9 + 0x50);
  uVar7 = *(undefined8 *)(lVar9 + 0x60);
  __return_storage_ptr__->rup = *(RealType *)(lVar9 + 0x58);
  *(undefined8 *)&__return_storage_ptr__->isPower = uVar7;
  __return_storage_ptr__->ru = RVar5;
  __return_storage_ptr__->rlp = RVar6;
  __return_storage_ptr__->v0p = RVar3;
  __return_storage_ptr__->rl = RVar4;
  __return_storage_ptr__->w0 = RVar1;
  __return_storage_ptr__->v0 = RVar2;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_);
  }
  return __return_storage_ptr__;
}

Assistant:

StickyAtypeParameters StickyAdapter::getStickyParam() {
    if (!isSticky()) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "StickyAdapter::getStickyParam was passed an atomType (%s)\n"
               "\tthat does not appear to be a Sticky atom.\n",
               at_->getName().c_str());
      painCave.severity = OPENMD_ERROR;
      painCave.isFatal  = 1;
      simError();
    }

    std::shared_ptr<GenericData> data = at_->getPropertyByName(StickyTypeID);
    if (data == nullptr) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "StickyAdapter::getStickyParam could not find Sticky\n"
               "\tparameters for atomType %s.\n",
               at_->getName().c_str());
      painCave.severity = OPENMD_ERROR;
      painCave.isFatal  = 1;
      simError();
    }

    std::shared_ptr<StickyAtypeData> stickyData =
        std::dynamic_pointer_cast<StickyAtypeData>(data);
    if (stickyData == nullptr) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "StickyAdapter::getStickyParam could not convert\n"
               "\tGenericData to StickyAtypeData for atom type %s\n",
               at_->getName().c_str());
      painCave.severity = OPENMD_ERROR;
      painCave.isFatal  = 1;
      simError();
    }

    return stickyData->getData();
  }